

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

TestSuite * __thiscall
testing::internal::UnitTestImpl::GetTestSuite
          (UnitTestImpl *this,string *test_suite_name,char *type_param,SetUpTestSuiteFunc set_up_tc,
          TearDownTestSuiteFunc tear_down_tc)

{
  bool bVar1;
  reference ppTVar2;
  pointer ppVar3;
  UnitTestImpl *this_00;
  size_type sVar4;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::TestSuite_*>,_false,_true>,_bool>
  pVar5;
  __type_conflict1 local_11d;
  value_type_conflict local_11c;
  TestSuite **local_118;
  __normal_iterator<testing::TestSuite_**,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>
  local_110;
  __normal_iterator<testing::TestSuite_**,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>
  local_108;
  const_iterator local_100;
  allocator<char> local_f1;
  string local_f0;
  undefined1 local_d0 [8];
  UnitTestFilter death_test_suite_filter;
  UnitTestImpl *local_60;
  TestSuite *new_test_suite;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::TestSuite_*>,_true>
  local_50;
  iterator item_it;
  pointer local_38;
  TearDownTestSuiteFunc tear_down_tc_local;
  SetUpTestSuiteFunc set_up_tc_local;
  char *type_param_local;
  string *test_suite_name_local;
  UnitTestImpl *this_local;
  
  local_38 = (pointer)tear_down_tc;
  tear_down_tc_local = set_up_tc;
  set_up_tc_local = (SetUpTestSuiteFunc)type_param;
  type_param_local = (char *)test_suite_name;
  test_suite_name_local = (string *)this;
  bVar1 = std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>::empty
                    (&this->test_suites_);
  local_11d = false;
  if (!bVar1) {
    std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>::rbegin
              ((vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_> *)
               &stack0xffffffffffffffc0);
    ppTVar2 = std::
              reverse_iterator<__gnu_cxx::__normal_iterator<testing::TestSuite_**,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>_>
              ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<testing::TestSuite_**,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>_>
                           *)&stack0xffffffffffffffc0);
    local_11d = std::operator==(&(*ppTVar2)->name_,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )type_param_local);
  }
  if (local_11d == false) {
    local_50._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::TestSuite_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::TestSuite_*>_>_>
         ::find(&this->test_suites_by_name_,(key_type *)type_param_local);
    new_test_suite =
         (TestSuite *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::TestSuite_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::TestSuite_*>_>_>
         ::end(&this->test_suites_by_name_);
    bVar1 = std::__detail::operator!=
                      (&local_50,
                       (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::TestSuite_*>,_true>
                        *)&new_test_suite);
    if (bVar1) {
      ppVar3 = std::__detail::
               _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::TestSuite_*>,_false,_true>
               ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::TestSuite_*>,_false,_true>
                             *)&local_50);
      this_local = (UnitTestImpl *)ppVar3->second;
    }
    else {
      this_00 = (UnitTestImpl *)operator_new(0x108);
      TestSuite::TestSuite
                ((TestSuite *)this_00,(string *)type_param_local,(char *)set_up_tc_local,
                 tear_down_tc_local,(TearDownTestSuiteFunc)local_38);
      local_60 = this_00;
      pVar5 = std::
              unordered_map<std::__cxx11::string,testing::TestSuite*,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,testing::TestSuite*>>>
              ::emplace<std::__cxx11::string_const&,testing::TestSuite*const&>
                        ((unordered_map<std::__cxx11::string,testing::TestSuite*,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,testing::TestSuite*>>>
                          *)&this->test_suites_by_name_,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         type_param_local,(TestSuite **)&local_60);
      death_test_suite_filter.exact_match_patterns_._M_h._M_single_bucket =
           (__node_base_ptr)
           pVar5.first.
           super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::TestSuite_*>,_true>
           ._M_cur;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f0,"*DeathTest:*DeathTest/*",&local_f1);
      anon_unknown_37::UnitTestFilter::UnitTestFilter((UnitTestFilter *)local_d0,&local_f0);
      std::__cxx11::string::~string((string *)&local_f0);
      std::allocator<char>::~allocator(&local_f1);
      bVar1 = anon_unknown_37::UnitTestFilter::MatchesName
                        ((UnitTestFilter *)local_d0,(string *)type_param_local);
      if (bVar1) {
        this->last_death_test_suite_ = this->last_death_test_suite_ + 1;
        local_110._M_current =
             (TestSuite **)
             std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>::begin
                       (&this->test_suites_);
        local_108 = __gnu_cxx::
                    __normal_iterator<testing::TestSuite_**,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>
                    ::operator+(&local_110,(long)this->last_death_test_suite_);
        __gnu_cxx::
        __normal_iterator<testing::TestSuite*const*,std::vector<testing::TestSuite*,std::allocator<testing::TestSuite*>>>
        ::__normal_iterator<testing::TestSuite**>
                  ((__normal_iterator<testing::TestSuite*const*,std::vector<testing::TestSuite*,std::allocator<testing::TestSuite*>>>
                    *)&local_100,&local_108);
        local_118 = (TestSuite **)
                    std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>::insert
                              (&this->test_suites_,local_100,(value_type *)&local_60);
      }
      else {
        std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>::push_back
                  (&this->test_suites_,(value_type *)&local_60);
      }
      sVar4 = std::vector<int,_std::allocator<int>_>::size(&this->test_suite_indices_);
      local_11c = (value_type_conflict)sVar4;
      std::vector<int,_std::allocator<int>_>::push_back(&this->test_suite_indices_,&local_11c);
      this_local = local_60;
      anon_unknown_37::UnitTestFilter::~UnitTestFilter((UnitTestFilter *)local_d0);
    }
  }
  else {
    std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>::rbegin
              ((vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_> *)&item_it);
    ppTVar2 = std::
              reverse_iterator<__gnu_cxx::__normal_iterator<testing::TestSuite_**,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>_>
              ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<testing::TestSuite_**,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>_>
                           *)&item_it);
    this_local = (UnitTestImpl *)*ppTVar2;
  }
  return (TestSuite *)this_local;
}

Assistant:

TestSuite* UnitTestImpl::GetTestSuite(
    const std::string& test_suite_name, const char* type_param,
    internal::SetUpTestSuiteFunc set_up_tc,
    internal::TearDownTestSuiteFunc tear_down_tc) {
  // During initialization, all TestInfos for a given suite are added in
  // sequence. To optimize this case, see if the most recently added suite is
  // the one being requested now.
  if (!test_suites_.empty() &&
      (*test_suites_.rbegin())->name_ == test_suite_name) {
    return *test_suites_.rbegin();
  }

  // Fall back to searching the collection.
  auto item_it = test_suites_by_name_.find(test_suite_name);
  if (item_it != test_suites_by_name_.end()) {
    return item_it->second;
  }

  // Not found. Create a new instance.
  auto* const new_test_suite =
      new TestSuite(test_suite_name, type_param, set_up_tc, tear_down_tc);
  test_suites_by_name_.emplace(test_suite_name, new_test_suite);

  const UnitTestFilter death_test_suite_filter(kDeathTestSuiteFilter);
  // Is this a death test suite?
  if (death_test_suite_filter.MatchesName(test_suite_name)) {
    // Yes.  Inserts the test suite after the last death test suite
    // defined so far.  This only works when the test suites haven't
    // been shuffled.  Otherwise we may end up running a death test
    // after a non-death test.
    ++last_death_test_suite_;
    test_suites_.insert(test_suites_.begin() + last_death_test_suite_,
                        new_test_suite);
  } else {
    // No.  Appends to the end of the list.
    test_suites_.push_back(new_test_suite);
  }

  test_suite_indices_.push_back(static_cast<int>(test_suite_indices_.size()));
  return new_test_suite;
}